

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O0

QWeakPointer<QObject> QtSharedPointer::weakPointerFromVariant_internal(QVariant *variant)

{
  QObject *extraout_RDX;
  Data *in_RDI;
  QWeakPointer<QObject> QVar1;
  QWeakPointer<QObject> *in_stack_ffffffffffffffd8;
  Data *this;
  
  this = in_RDI;
  ::QVariant::constData((QVariant *)0x62fac9);
  QWeakPointer<QObject>::QWeakPointer((QWeakPointer<QObject> *)this,in_stack_ffffffffffffffd8);
  QVar1.value = extraout_RDX;
  QVar1.d = in_RDI;
  return QVar1;
}

Assistant:

QWeakPointer<QObject> QtSharedPointer::weakPointerFromVariant_internal(const QVariant &variant)
{
    Q_ASSERT(variant.metaType().flags() & QMetaType::WeakPointerToQObject ||
             variant.metaType().flags() & QMetaType::TrackingPointerToQObject);
    return *reinterpret_cast<const QWeakPointer<QObject>*>(variant.constData());
}